

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

char * lys_nodetype2str(uint16_t nodetype)

{
  char *pcStack_10;
  uint16_t nodetype_local;
  
  if (nodetype == 1) {
    pcStack_10 = "container";
  }
  else if (nodetype == 2) {
    pcStack_10 = "choice";
  }
  else if (nodetype == 4) {
    pcStack_10 = "leaf";
  }
  else if (nodetype == 8) {
    pcStack_10 = "leaf-list";
  }
  else if (nodetype == 0x10) {
    pcStack_10 = "list";
  }
  else if (nodetype == 0x20) {
    pcStack_10 = "anyxml";
  }
  else if (nodetype == 0x60) {
    pcStack_10 = "anydata";
  }
  else if (nodetype == 0x80) {
    pcStack_10 = "case";
  }
  else if (nodetype == 0x100) {
    pcStack_10 = "RPC";
  }
  else if (nodetype == 0x200) {
    pcStack_10 = "action";
  }
  else if (nodetype == 0x400) {
    pcStack_10 = "notification";
  }
  else if (nodetype == 0x800) {
    pcStack_10 = "uses";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

LIBYANG_API_DEF const char *
lys_nodetype2str(uint16_t nodetype)
{
    switch (nodetype) {
    case LYS_CONTAINER:
        return "container";
    case LYS_CHOICE:
        return "choice";
    case LYS_LEAF:
        return "leaf";
    case LYS_LEAFLIST:
        return "leaf-list";
    case LYS_LIST:
        return "list";
    case LYS_ANYXML:
        return "anyxml";
    case LYS_ANYDATA:
        return "anydata";
    case LYS_CASE:
        return "case";
    case LYS_RPC:
        return "RPC";
    case LYS_ACTION:
        return "action";
    case LYS_NOTIF:
        return "notification";
    case LYS_USES:
        return "uses";
    default:
        return "unknown";
    }
}